

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::flagTaggedStates(RBBITableBuilder *this)

{
  UBool UVar1;
  int32_t iVar2;
  void *obj;
  void *pvVar3;
  RBBIStateDescriptor *sd;
  int32_t local_48;
  int32_t local_44;
  int32_t n;
  int32_t i;
  RBBINode *tagNode;
  UVector tagNodes;
  RBBITableBuilder *this_local;
  
  tagNodes.comparer = (UElementsAreEqual *)this;
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    UVector::UVector((UVector *)&tagNode,this->fStatus);
    UVar1 = ::U_FAILURE(*this->fStatus);
    if (UVar1 == '\0') {
      RBBINode::findNodes(*this->fTree,(UVector *)&tagNode,tag,this->fStatus);
      UVar1 = ::U_FAILURE(*this->fStatus);
      if (UVar1 == '\0') {
        for (local_44 = 0; iVar2 = UVector::size((UVector *)&tagNode), local_44 < iVar2;
            local_44 = local_44 + 1) {
          obj = UVector::elementAt((UVector *)&tagNode,local_44);
          for (local_48 = 0; iVar2 = UVector::size(this->fDStates), local_48 < iVar2;
              local_48 = local_48 + 1) {
            pvVar3 = UVector::elementAt(this->fDStates,local_48);
            iVar2 = UVector::indexOf(*(UVector **)((long)pvVar3 + 0x20),obj,0);
            if (-1 < iVar2) {
              sortedAdd(this,(UVector **)((long)pvVar3 + 0x10),*(int32_t *)((long)obj + 0x7c));
            }
          }
        }
      }
    }
    UVector::~UVector((UVector *)&tagNode);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagTaggedStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     tagNodes(*fStatus);
    RBBINode    *tagNode;
    int32_t     i;
    int32_t     n;

    if (U_FAILURE(*fStatus)) {
        return;
    }
    fTree->findNodes(&tagNodes, RBBINode::tag, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    for (i=0; i<tagNodes.size(); i++) {                   // For each tag node t (all of 'em)
        tagNode = (RBBINode *)tagNodes.elementAt(i);

        for (n=0; n<fDStates->size(); n++) {              //    For each state  s (row in the state table)
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(tagNode) >= 0) {  //       if  s include the tag node t
                sortedAdd(&sd->fTagVals, tagNode->fVal);
            }
        }
    }
}